

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef
CompileLlvmVariableDefinitions(LlvmCompilationContext *ctx,ExprVariableDefinitions *node)

{
  ExprBase *expression;
  LLVMValueRef pLVar1;
  IntrusiveList<ExprBase> *pIVar2;
  
  pIVar2 = &node->definitions;
  while (expression = pIVar2->head, expression != (ExprBase *)0x0) {
    CompileLlvm(ctx,expression);
    pIVar2 = (IntrusiveList<ExprBase> *)&expression->next;
  }
  pLVar1 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
  return pLVar1;
}

Assistant:

LLVMValueRef CompileLlvmVariableDefinitions(LlvmCompilationContext &ctx, ExprVariableDefinitions *node)
{
	for(ExprBase *value = node->definitions.head; value; value = value->next)
		CompileLlvm(ctx, value);

	return CheckType(ctx, node, NULL);
}